

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

int Lodtalk::SmalltalkImage::stQuitPrimitive(InterpreterProxy *interpreter)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SmallIntegerValue SVar3;
  anon_union_8_4_0eb573b0_for_Oop_0 local_20;
  Oop exitCodeObject;
  int exitCode;
  InterpreterProxy *interpreter_local;
  
  exitCodeObject.field_0.uintValue._4_4_ = 0;
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar2) == 1) {
    local_20._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    local_20.uintValue._4_4_ = extraout_var_00;
    bVar1 = Oop::isSmallInteger((Oop *)&local_20);
    if (bVar1) {
      SVar3 = Oop::decodeSmallInteger((Oop *)&local_20);
      exitCodeObject.field_0.uintValue._4_4_ = (undefined4)SVar3;
    }
  }
  exit(exitCodeObject.field_0.intValue._4_4_);
}

Assistant:

int SmalltalkImage::stQuitPrimitive(InterpreterProxy *interpreter)
{
    int exitCode = 0;
    if (interpreter->getArgumentCount() == 1)
    {
        auto exitCodeObject = interpreter->getTemporary(0);
        if (exitCodeObject.isSmallInteger())
            exitCode = (int)exitCodeObject.decodeSmallInteger();
    }

    exit(exitCode);
    // Should never reach here.
}